

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionalestimator.cxx
# Opt level: O0

void __thiscall
ConditionalEstimator::ConditionalEstimator
          (ConditionalEstimator *this,Property *property,StochasticProcess *stochvar,
          StochasticProcess *condition,Time *time,int pre,int post,int updateCorrection)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  double *pdVar9;
  double **ppdVar10;
  int local_98;
  allocator<char> local_91;
  int i;
  allocator<char> local_59;
  string local_58;
  int local_34;
  Time *pTStack_30;
  int pre_local;
  Time *time_local;
  StochasticProcess *condition_local;
  StochasticProcess *stochvar_local;
  Property *property_local;
  ConditionalEstimator *this_local;
  
  local_34 = pre;
  pTStack_30 = time;
  time_local = (Time *)condition;
  condition_local = stochvar;
  stochvar_local = (StochasticProcess *)property;
  property_local = (Property *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"Estimator",&local_91);
  Estimator::Estimator(&this->super_Estimator,stochvar,time,&local_58,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  (this->super_Estimator).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__ConditionalEstimator_0018e740;
  Ring<double>::Ring(&this->condSampleRing,local_34 + 1 + post);
  Ring<bool>::Ring(&this->condEventRing,0);
  Ring<double>::Ring(&this->condConditionRing,local_34 + 1 + post);
  (this->super_Estimator).nEstimate =
       *(Property *)&(stochvar_local->super_Parametric)._vptr_Parametric;
  (this->super_Estimator).pSource = condition_local;
  this->condTrigger = (StochasticEventGenerator *)0x0;
  this->condCondition = (StochasticProcess *)time_local;
  (this->super_Estimator).nSamples = 0;
  this->aDist = (double **)0x0;
  this->nDist = 0;
  this->condSamples = (double *)0x0;
  this->aOne = (double *)0x0;
  this->aTwo = (double *)0x0;
  this->aThree = (double *)0x0;
  this->aEvents = (double *)0x0;
  this->nPre = local_34;
  this->nPost = post;
  this->nUpdateCorrection = updateCorrection;
  if (((this->super_Estimator).nEstimate & 1U) != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(local_34 + 1 + post);
    uVar8 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pdVar9 = (double *)operator_new__(uVar8);
    this->condSamples = pdVar9;
  }
  if (((this->super_Estimator).nEstimate & 4U) != 0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(local_34 + 1 + post);
    uVar8 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pdVar9 = (double *)operator_new__(uVar8);
    this->aOne = pdVar9;
  }
  if (((this->super_Estimator).nEstimate & 0x20U) != 0) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)(local_34 + 1 + post);
    uVar8 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pdVar9 = (double *)operator_new__(uVar8);
    this->aEvents = pdVar9;
  }
  if (((this->super_Estimator).nEstimate & 8U) != 0) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)(local_34 + 1 + post);
    uVar8 = SUB168(auVar4 * ZEXT816(8),0);
    if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pdVar9 = (double *)operator_new__(uVar8);
    this->aTwo = pdVar9;
  }
  if (((this->super_Estimator).nEstimate & 0x10U) != 0) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)(local_34 + 1 + post);
    uVar8 = SUB168(auVar5 * ZEXT816(8),0);
    if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pdVar9 = (double *)operator_new__(uVar8);
    this->aThree = pdVar9;
  }
  if (((this->super_Estimator).nEstimate & 2U) != 0) {
    this->nDist = 100;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)(local_34 + 1 + post);
    uVar8 = SUB168(auVar6 * ZEXT816(8),0);
    if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    ppdVar10 = (double **)operator_new__(uVar8);
    this->aDist = ppdVar10;
    for (local_98 = 0; local_98 < local_34 + post + 1; local_98 = local_98 + 1) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (long)this->nDist;
      uVar8 = SUB168(auVar7 * ZEXT816(8),0);
      if (SUB168(auVar7 * ZEXT816(8),8) != 0) {
        uVar8 = 0xffffffffffffffff;
      }
      pdVar9 = (double *)operator_new__(uVar8);
      this->aDist[local_98] = pdVar9;
    }
    this->aDistRange[0] = -5.0;
    this->aDistRange[1] = 65.0;
    this->dDistOffset = this->aDistRange[0];
    this->dDistScale = (this->aDistRange[1] - this->aDistRange[0]) / (double)this->nDist;
  }
  (*(this->super_Estimator).super_Parametric._vptr_Parametric[4])();
  return;
}

Assistant:

ConditionalEstimator::ConditionalEstimator(const Property& property, StochasticProcess *stochvar, StochasticProcess *condition, Time *time,  int pre, int post, int updateCorrection)
	: Estimator(stochvar, time), condSampleRing(pre+post+1), condEventRing(0), condConditionRing(pre+post+1)
{
	nEstimate = property;
	pSource = stochvar;
	condTrigger = 0;
	condCondition = condition;
	nSamples = 0;
	aDist = 0;
	nDist = 0;
	condSamples = 0;
	aOne = 0;
	aTwo = 0;
	aThree = 0;
	aEvents = 0;
	nPre = pre;
	nPost = post;
	nUpdateCorrection = updateCorrection;
	if(nEstimate & EST_SAMPLE)
		condSamples = new double[pre+post+1];
	if(nEstimate & EST_MEAN)
		aOne = new double[pre+post+1];
	if(nEstimate & EST_EVENTS)
		aEvents = new double[pre+post+1];
	if(nEstimate & EST_VAR)
		aTwo = new double[pre+post+1];
	if(nEstimate & EST_CUR)
		aThree = new double[pre+post+1];
	if(nEstimate & EST_DENS) {
		nDist = 100;
		aDist = new double *[pre+post+1];
		for( int i=0; i<pre+post+1; i++ )
			aDist[i] = new double[nDist];
		aDistRange[0] = -5.0;
		aDistRange[1] = 65.0;
		dDistOffset = double(aDistRange[0]);
		dDistScale = (double(aDistRange[1]) - double(aDistRange[0])) / double(nDist);
	}
	init();
}